

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::usub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 extraout_RDX;
  APInt AVar2;
  APInt local_40;
  undefined1 local_29;
  undefined8 local_28;
  bool *Overflow_local;
  APInt *RHS_local;
  APInt *this_local;
  APInt *Res;
  
  local_28 = CONCAT71(in_register_00000009,in_CL);
  local_29 = 0;
  Overflow_local = Overflow;
  RHS_local = RHS;
  this_local = this;
  APInt(&local_40,RHS);
  llvm::operator-((llvm *)this,&local_40,(APInt *)Overflow_local);
  ~APInt(&local_40);
  bVar1 = ugt(this,RHS);
  *(bool *)local_28 = bVar1;
  AVar2._8_8_ = extraout_RDX;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::usub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this-RHS;
  Overflow = Res.ugt(*this);
  return Res;
}